

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O0

BOOL __thiscall
Memory::SmallHeapBlockT<SmallAllocationBlockAttributes>::IsValidObject
          (SmallHeapBlockT<SmallAllocationBlockAttributes> *this,void *objectAddress)

{
  BOOLEAN BVar1;
  ushort uVar2;
  char *pcVar3;
  SmallHeapBlockBitVector *this_00;
  ushort index;
  void *objectAddress_local;
  SmallHeapBlockT<SmallAllocationBlockAttributes> *this_local;
  
  pcVar3 = GetAddress(this);
  if ((pcVar3 <= objectAddress) && (pcVar3 = GetEndAddress(this), objectAddress < pcVar3)) {
    uVar2 = GetAddressIndex(this,objectAddress);
    if (uVar2 == 0xffff) {
      return 0;
    }
    this_00 = GetDebugFreeBitVector(this);
    uVar2 = GetAddressBitIndex(objectAddress);
    BVar1 = BVStatic<256UL>::Test(this_00,(uint)uVar2);
    return (uint)((BVar1 != '\0' ^ 0xffU) & 1);
  }
  return 0;
}

Assistant:

BOOL
SmallHeapBlockT<TBlockAttributes>::IsValidObject(void* objectAddress)
{
    if (objectAddress < this->GetAddress() || objectAddress >= this->GetEndAddress())
    {
        return false;
    }
    ushort index = GetAddressIndex(objectAddress);
    if (index == SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit)
    {
        return false;
    }
#if DBG
    return !this->GetDebugFreeBitVector()->Test(GetAddressBitIndex(objectAddress));
#else
    return true;
#endif
}